

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O0

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *composite_sinusoidal_modeling,
          vector<double,_std::allocator<double>_> *autocorrelation)

{
  double dVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar7;
  int i;
  double sum;
  int l;
  double *v;
  double *intensities;
  double *frequencies;
  int length;
  int local_54;
  double local_50;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  
  iVar6 = *(int *)(in_RDI + 8) << 1;
  if ((((*(byte *)(in_RDI + 0xc) & 1) != 0) &&
      (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar2 == (long)iVar6)) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar2 != (long)iVar6) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffc0,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)*(int *)(in_RDI + 8));
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    for (iVar8 = 0; iVar8 < iVar6; iVar8 = iVar8 + 1) {
      local_50 = 0.0;
      for (local_54 = 0; local_54 < *(int *)(in_RDI + 8); local_54 = local_54 + 1) {
        dVar1 = pvVar4[local_54];
        dVar7 = cos((double)iVar8 * pvVar3[local_54]);
        local_50 = dVar1 * dVar7 + local_50;
      }
      pvVar5[iVar8] = local_50;
    }
    return true;
  }
  return false;
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    const std::vector<double>& composite_sinusoidal_modeling,
    std::vector<double>* autocorrelation) const {
  // Check inputs.
  const int length(num_sine_wave_ * 2);
  if (!is_valid_ ||
      composite_sinusoidal_modeling.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }

  const double* frequencies(&(composite_sinusoidal_modeling[0]));
  const double* intensities(&(composite_sinusoidal_modeling[num_sine_wave_]));
  double* v(&((*autocorrelation)[0]));

  // Calculate autocorrelation using Eq. (2).
  for (int l(0); l < length; ++l) {
    double sum(0.0);
    for (int i(0); i < num_sine_wave_; ++i) {
      sum += intensities[i] * std::cos(l * frequencies[i]);
    }
    v[l] = sum;
  }

  return true;
}